

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MilStoragePython.cpp
# Opt level: O2

PyObject * PyInit_libmilstoragepython(void)

{
  int iVar1;
  undefined8 uVar2;
  class_<CoreML::MilStoragePython::MilStoragePythonWriter> *pcVar3;
  class_<CoreML::MilStoragePython::MilStoragePythonReader> *pcVar4;
  bool local_c9;
  class_<CoreML::MilStoragePython::MilStoragePythonWriter> blobStorageWriter;
  module m;
  int minor;
  int major;
  class_<CoreML::MilStoragePython::MilStoragePythonReader> blobStorageReader;
  arg local_a0;
  code *local_90;
  undefined8 local_88;
  arg local_80;
  arg_v local_70;
  code *local_30;
  undefined8 local_28;
  code *local_20;
  undefined8 local_18;
  
  uVar2 = Py_GetVersion();
  iVar1 = __isoc99_sscanf(uVar2,"%i.%i",&major,&minor);
  if (iVar1 == 2) {
    if (minor == 10 && major == 3) {
      pybind11::module::module
                (&m,"libmilstoragepython","Library to create, access and edit CoreML blob files.");
      pybind11::class_<CoreML::MilStoragePython::MilStoragePythonWriter>::class_<>
                (&blobStorageWriter,(handle)m.super_object.super_handle.m_ptr,"_BlobStorageWriter");
      local_a0.name = "file_name";
      local_a0._8_8_ = local_a0._8_8_ & 0xffffffffffffff00;
      local_c9 = true;
      local_80.name = "truncate_file";
      local_80._8_8_ = local_80._8_8_ & 0xffffffffffffff00;
      pybind11::arg::operator=(&local_70,&local_80,&local_c9);
      pybind11::detail::
      init<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool>
      ::
      execute<pybind11::class_<CoreML::MilStoragePython::MilStoragePythonWriter>,_pybind11::arg,_pybind11::arg_v,_0>
                (&blobStorageWriter,&local_a0,&local_70);
      local_90 = CoreML::MilStoragePython::MilStoragePythonWriter::write_int8_data;
      local_88 = 0;
      pcVar3 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonWriter>::
               def<unsigned_long(CoreML::MilStoragePython::MilStoragePythonWriter::*)(std::vector<signed_char,std::allocator<signed_char>>const&)>
                         (&blobStorageWriter,"write_int8_data",
                          (offset_in_MilStoragePythonWriter_to_subr *)&local_90);
      blobStorageReader.super_generic_type.super_object.super_handle.m_ptr =
           (generic_type)CoreML::MilStoragePython::MilStoragePythonWriter::write_uint8_data;
      pcVar3 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonWriter>::
               def<unsigned_long(CoreML::MilStoragePython::MilStoragePythonWriter::*)(std::vector<unsigned_char,std::allocator<unsigned_char>>const&)>
                         (pcVar3,"write_uint8_data",
                          (offset_in_MilStoragePythonWriter_to_subr *)&blobStorageReader);
      local_20 = CoreML::MilStoragePython::MilStoragePythonWriter::write_fp16_data;
      local_18 = 0;
      pcVar3 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonWriter>::
               def<unsigned_long(CoreML::MilStoragePython::MilStoragePythonWriter::*)(std::vector<unsigned_short,std::allocator<unsigned_short>>const&)>
                         (pcVar3,"write_fp16_data",
                          (offset_in_MilStoragePythonWriter_to_subr *)&local_20);
      local_30 = CoreML::MilStoragePython::MilStoragePythonWriter::write_float_data;
      local_28 = 0;
      pybind11::class_<CoreML::MilStoragePython::MilStoragePythonWriter>::
      def<unsigned_long(CoreML::MilStoragePython::MilStoragePythonWriter::*)(std::vector<float,std::allocator<float>>const&)>
                (pcVar3,"write_float_data",(offset_in_MilStoragePythonWriter_to_subr *)&local_30);
      pybind11::arg_v::~arg_v(&local_70);
      pybind11::class_<CoreML::MilStoragePython::MilStoragePythonReader>::class_<>
                (&blobStorageReader,(handle)m.super_object.super_handle.m_ptr,"_BlobStorageReader");
      pybind11::detail::
      init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      execute<pybind11::class_<CoreML::MilStoragePython::MilStoragePythonReader>,_0>
                (&blobStorageReader);
      local_70.super_arg.name =
           (char *)CoreML::MilStoragePython::MilStoragePythonReader::read_int8_data;
      local_70.super_arg._8_8_ = 0;
      pcVar4 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonReader>::
               def<std::vector<signed_char,std::allocator<signed_char>>const(CoreML::MilStoragePython::MilStoragePythonReader::*)(unsigned_long)>
                         (&blobStorageReader,"read_int8_data",
                          (offset_in_MilStoragePythonWriter_to_subr *)&local_70);
      local_a0.name = (char *)CoreML::MilStoragePython::MilStoragePythonReader::read_uint8_data;
      local_a0._8_8_ = 0;
      pcVar4 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonReader>::
               def<std::vector<unsigned_char,std::allocator<unsigned_char>>const(CoreML::MilStoragePython::MilStoragePythonReader::*)(unsigned_long)>
                         (pcVar4,"read_uint8_data",
                          (offset_in_MilStoragePythonWriter_to_subr *)&local_a0);
      local_80.name = (char *)CoreML::MilStoragePython::MilStoragePythonReader::read_fp16_data;
      local_80._8_8_ = 0;
      pcVar4 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonReader>::
               def<std::vector<unsigned_short,std::allocator<unsigned_short>>const(CoreML::MilStoragePython::MilStoragePythonReader::*)(unsigned_long)>
                         (pcVar4,"read_fp16_data",
                          (offset_in_MilStoragePythonWriter_to_subr *)&local_80);
      local_90 = CoreML::MilStoragePython::MilStoragePythonReader::read_float_data;
      local_88 = 0;
      pybind11::class_<CoreML::MilStoragePython::MilStoragePythonReader>::
      def<std::vector<float,std::allocator<float>>const(CoreML::MilStoragePython::MilStoragePythonReader::*)(unsigned_long)>
                (pcVar4,"read_float_data",(offset_in_MilStoragePythonWriter_to_subr *)&local_90);
      pybind11::object::~object((object *)&blobStorageReader);
      pybind11::object::~object((object *)&blobStorageWriter);
      pybind11::object::~object(&m.super_object);
    }
    else {
      PyErr_Format(_PyExc_ImportError,
                   "Python version mismatch: module was compiled for version %i.%i, while the interpreter is running version %i.%i."
                   ,3,10);
      m.super_object.super_handle.m_ptr = (object)(object)(PyObject *)0x0;
    }
  }
  else {
    PyErr_SetString(_PyExc_ImportError,"Can\'t parse Python version.");
    m.super_object.super_handle.m_ptr = (object)(handle)0x0;
  }
  return (PyObject *)m.super_object.super_handle.m_ptr;
}

Assistant:

PYBIND11_PLUGIN(libmilstoragepython) {
    py::module m("libmilstoragepython", "Library to create, access and edit CoreML blob files.");

    py::class_<MilStoragePythonWriter> blobStorageWriter(m, "_BlobStorageWriter");
    blobStorageWriter.def(py::init<const std::string&, bool>(), py::arg("file_name"), py::arg("truncate_file") = true)
      .def("write_int8_data", &MilStoragePythonWriter::write_int8_data)
      .def("write_uint8_data", &MilStoragePythonWriter::write_uint8_data)
      .def("write_fp16_data", &MilStoragePythonWriter::write_fp16_data)
      .def("write_float_data", &MilStoragePythonWriter::write_float_data);

    py::class_<MilStoragePythonReader> blobStorageReader(m, "_BlobStorageReader");
    blobStorageReader.def(py::init<std::string>())
      .def("read_int8_data", &MilStoragePythonReader::read_int8_data)
      .def("read_uint8_data", &MilStoragePythonReader::read_uint8_data)
      .def("read_fp16_data", &MilStoragePythonReader::read_fp16_data)
      .def("read_float_data", &MilStoragePythonReader::read_float_data);

    return m.ptr();
}